

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.c
# Opt level: O0

void opl_set_mute_mask(void *chip,UINT32 MuteMask)

{
  byte local_21;
  UINT8 CurChn;
  FM_OPL *opl;
  UINT32 MuteMask_local;
  void *chip_local;
  
  for (local_21 = 0; local_21 < 9; local_21 = local_21 + 1) {
    *(byte *)((long)chip + (ulong)local_21 * 0xc0 + 0xdd) =
         (byte)(MuteMask >> (local_21 & 0x1f)) & 1;
  }
  for (local_21 = 0; local_21 < 6; local_21 = local_21 + 1) {
    *(byte *)((long)chip + (ulong)local_21 + 0x6e0) = (byte)(MuteMask >> (local_21 + 9 & 0x1f)) & 1;
  }
  return;
}

Assistant:

void opl_set_mute_mask(void *chip, UINT32 MuteMask)
{
	FM_OPL *opl = (FM_OPL *)chip;
	UINT8 CurChn;
	
	for (CurChn = 0; CurChn < 9; CurChn ++)
		opl->P_CH[CurChn].Muted = (MuteMask >> CurChn) & 0x01;
	for (CurChn = 0; CurChn < 6; CurChn ++)
		opl->MuteSpc[CurChn] = (MuteMask >> (9 + CurChn)) & 0x01;
	
	return;
}